

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_pcm_s32_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  int iVar1;
  ma_uint64 mVar2;
  ma_int32 *src_s32;
  ma_int16 *dst_s16;
  int iVar3;
  int iVar4;
  ma_lcg mVar5;
  uint uVar6;
  undefined2 uVar7;
  
  if (ditherMode == ma_dither_mode_none) {
    if (count != 0) {
      mVar2 = 0;
      do {
        *(undefined2 *)((long)dst + mVar2 * 2) = *(undefined2 *)((long)src + mVar2 * 4 + 2);
        mVar2 = mVar2 + 1;
      } while (count != mVar2);
    }
  }
  else if (count != 0) {
    mVar2 = 0;
    mVar5.state = g_maLCG.state;
    do {
      iVar1 = *(int *)((long)src + mVar2 * 4);
      if (ditherMode == ma_dither_mode_triangle) {
        iVar3 = mVar5.state * 0xbc8f;
        uVar6 = iVar3 + ((int)((long)iVar3 * 0x40000001 >> 0x3d) - (iVar3 >> 0x1f)) * -0x7fffffff;
        iVar3 = uVar6 * 0xbc8f;
        iVar4 = (int)((long)iVar3 * 0x40000001 >> 0x3d) - (iVar3 >> 0x1f);
        mVar5.state = iVar4 * -0x80000000 + iVar3 + iVar4;
        iVar3 = uVar6 / 0x1fffd + ((uint)mVar5.state >> 0x11) + -0x8000;
        g_maLCG.state = mVar5.state;
      }
      else if (ditherMode == ma_dither_mode_rectangle) {
        iVar3 = mVar5.state * 0xbc8f;
        iVar4 = (int)((long)iVar3 * 0x40000001 >> 0x3d) - (iVar3 >> 0x1f);
        mVar5.state = iVar4 * -0x80000000 + iVar3 + iVar4;
        iVar3 = ((uint)mVar5.state >> 0x10) - 0x8000;
        g_maLCG.state = mVar5.state;
      }
      else {
        iVar3 = 0;
      }
      if ((long)iVar3 + (long)iVar1 < 0x80000000) {
        uVar7 = (undefined2)((uint)(iVar3 + iVar1) >> 0x10);
      }
      else {
        uVar7 = 0x7fff;
      }
      *(undefined2 *)((long)dst + mVar2 * 2) = uVar7;
      mVar2 = mVar2 + 1;
    } while (count != mVar2);
    return;
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_s32_to_s16__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_int16* dst_s16 = (ma_int16*)dst;
    const ma_int32* src_s32 = (const ma_int32*)src;

    if (ditherMode == ma_dither_mode_none) {
        ma_uint64 i;
        for (i = 0; i < count; i += 1) {
            ma_int32 x = src_s32[i];
            x = x >> 16;
            dst_s16[i] = (ma_int16)x;
        }
    } else {
        ma_uint64 i;
        for (i = 0; i < count; i += 1) {
            ma_int32 x = src_s32[i];

            /* Dither. Don't overflow. */
            ma_int32 dither = ma_dither_s32(ditherMode, -0x8000, 0x7FFF);
            if ((ma_int64)x + dither <= 0x7FFFFFFF) {
                x = x + dither;
            } else {
                x = 0x7FFFFFFF;
            }
            
            x = x >> 16;
            dst_s16[i] = (ma_int16)x;
        }
    }
}